

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_float32_suite::test_array16_float32_one(void)

{
  view_type *pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  undefined4 local_6c;
  value local_68 [2];
  undefined4 local_60;
  undefined4 local_5c;
  value_type expected [4];
  undefined4 local_50;
  value local_4c [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [7];
  
  decoder.current.view._M_str._1_4_ = 0x4bd;
  decoder.current.view._M_str._5_2_ = 0x8000;
  decoder.current.view._M_str._7_1_ = 0x3f;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[7]>
            ((decoder *)local_38,(uchar (*) [7])((long)&decoder.current.view._M_str + 1));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xbd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd57,"void compact_float32_suite::test_array16_float32_one()",local_40,&local_44);
  local_4c[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_38);
  local_50 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd58,"void compact_float32_suite::test_array16_float32_one()",local_4c,&local_50);
  expected = (value_type  [4])
             trial::protocol::bintoken::detail::decoder::category((decoder *)local_38);
  local_5c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd59,"void compact_float32_suite::test_array16_float32_one()",expected,&local_5c);
  local_60 = 0x3f800000;
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_38);
  pvVar2 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::begin(pvVar1);
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_38);
  pvVar3 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::end(pvVar1);
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd5f,"void compact_float32_suite::test_array16_float32_one()",pvVar2,pvVar3,&local_60
             ,&local_5c);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_68[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_6c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd61,"void compact_float32_suite::test_array16_float32_one()",local_68,&local_6c);
  return;
}

Assistant:

void test_array16_float32_one()
{
    const value_type input[] = { token::code::array16_float32, 0x04, 0x00, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_float32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x00, 0x00, 0x80, 0x3F
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}